

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edata_cache.c
# Opt level: O2

edata_t * duckdb_je_edata_cache_get(tsdn_t *tsdn,edata_cache_t *edata_cache)

{
  edata_t *peVar1;
  
  malloc_mutex_lock(tsdn,&edata_cache->mtx);
  peVar1 = duckdb_je_edata_avail_first(&edata_cache->avail);
  if (peVar1 != (edata_t *)0x0) {
    duckdb_je_edata_avail_remove(&edata_cache->avail,peVar1);
    (edata_cache->count).repr = (edata_cache->count).repr - 1;
    (edata_cache->mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&(edata_cache->mtx).field_0 + 0x48));
    return peVar1;
  }
  (edata_cache->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(edata_cache->mtx).field_0 + 0x48));
  peVar1 = duckdb_je_base_alloc_edata(tsdn,edata_cache->base);
  return peVar1;
}

Assistant:

edata_t *
edata_cache_get(tsdn_t *tsdn, edata_cache_t *edata_cache) {
	malloc_mutex_lock(tsdn, &edata_cache->mtx);
	edata_t *edata = edata_avail_first(&edata_cache->avail);
	if (edata == NULL) {
		malloc_mutex_unlock(tsdn, &edata_cache->mtx);
		return base_alloc_edata(tsdn, edata_cache->base);
	}
	edata_avail_remove(&edata_cache->avail, edata);
	atomic_load_sub_store_zu(&edata_cache->count, 1);
	malloc_mutex_unlock(tsdn, &edata_cache->mtx);
	return edata;
}